

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O3

_Bool do_cmd_open_chest(loc grid,object *obj)

{
  uint32_t *puVar1;
  bitflag *pbVar2;
  _Bool _Var3;
  byte bVar4;
  uint32_t uVar5;
  int iVar6;
  wchar_t wVar7;
  int iVar8;
  _Bool scatter;
  _Bool local_29;
  
  if (0 < obj->pval) {
    wVar7 = (player->state).skills[0];
    if (player->timed[2] == 0) {
      _Var3 = no_light(player);
      if (_Var3) goto LAB_001883e1;
    }
    else {
LAB_001883e1:
      wVar7 = wVar7 / 10;
    }
    if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
      wVar7 = wVar7 / 10;
    }
    iVar8 = wVar7 - obj->pval;
    iVar6 = 2;
    if (2 < iVar8) {
      iVar6 = iVar8;
    }
    uVar5 = Rand_div(100);
    if (iVar6 <= (int)uVar5) {
      event_signal(EVENT_INPUT_FLUSH);
      msgt(0x1c,"You failed to pick the lock.");
      _Var3 = true;
      goto LAB_00188509;
    }
    msgt(0x57,"You have picked the lock.");
    player_exp_gain(player,1);
  }
  local_29 = false;
  _Var3 = player_is_trapsafe(player);
  if (_Var3) {
    if (0 < obj->pval) {
      _Var3 = player_of_has(player,L'(');
      if (_Var3) {
        equip_learn_flag(player,L'(');
      }
    }
    bVar4 = 0;
  }
  else {
    chest_trap(obj,&local_29);
    bVar4 = local_29;
  }
  chest_death(grid,obj,(_Bool)(bVar4 & 1));
  puVar1 = &player->upkeep->notice;
  *puVar1 = *puVar1 | 2;
  _Var3 = false;
LAB_00188509:
  if (obj->pval == 0) {
    pbVar2 = &obj->known->notice;
    *pbVar2 = *pbVar2 | 4;
  }
  square_light_spot((chunk *)cave,grid);
  return _Var3;
}

Assistant:

bool do_cmd_open_chest(struct loc grid, struct object *obj)
{
	int i, j;

	bool flag = true;

	bool more = false;

	/* Attempt to unlock it */
	if (obj->pval > 0) {
		/* Assume locked, and thus not open */
		flag = false;

		/* Get the "disarm" factor */
		i = player->state.skills[SKILL_DISARM_PHYS];

		/* Penalize some conditions */
		if (player->timed[TMD_BLIND] || no_light(player)) i = i / 10;
		if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) i = i / 10;

		/* Extract the difficulty */
		j = i - obj->pval;

		/* Always have a small chance of success */
		if (j < 2) j = 2;

		/* Success -- May still have traps */
		if (randint0(100) < j) {
			msgt(MSG_LOCKPICK, "You have picked the lock.");
			player_exp_gain(player, 1);
			flag = true;
		} else {
			/* We may continue repeating */
			more = true;
			event_signal(EVENT_INPUT_FLUSH);
			msgt(MSG_LOCKPICK_FAIL, "You failed to pick the lock.");
		}
	}

	/* Allowed to open */
	if (flag) {
		bool scatter = false;

		/* Apply chest traps, if any and player is not trapsafe */
		if (!player_is_trapsafe(player)) {
			chest_trap(obj, &scatter);
		} else if ((obj->pval > 0) && player_of_has(player, OF_TRAP_IMMUNE)) {
			/* Learn trap immunity if there are traps */
			equip_learn_flag(player, OF_TRAP_IMMUNE);
		}

		/* Let the Chest drop items */
		chest_death(grid, obj, scatter);

		/* Ignore chest if autoignore calls for it */
		player->upkeep->notice |= PN_IGNORE;
	}

	/* Empty chests were always ignored in ignore_item_okay so we
	 * might as well ignore it here
	 */
	if (obj->pval == 0)
		obj->known->notice |= OBJ_NOTICE_IGNORE;

	/* Redraw chest, to be on the safe side (it may have been ignored) */
	square_light_spot(cave, grid);

	/* Result */
	return (more);
}